

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O0

void analyze_region(FIRSTPASS_STATS *stats,int k,REGIONS *regions)

{
  double local_60;
  double local_58;
  double local_50;
  double local_40;
  double this_ratio;
  double max_coded_error;
  double num_frames;
  int check_first_sr;
  int i;
  REGIONS *regions_local;
  int k_local;
  FIRSTPASS_STATS *stats_local;
  
  regions[k].avg_cor_coeff = 0.0;
  regions[k].avg_sr_fr_ratio = 0.0;
  regions[k].avg_intra_err = 0.0;
  regions[k].avg_coded_err = 0.0;
  for (i = regions[k].start; i <= regions[k].last; i = i + 1) {
    if ((regions[k].start < i) || ((k != 0) != 0)) {
      if (stats[i].coded_error < stats[i + -1].coded_error ||
          stats[i].coded_error == stats[i + -1].coded_error) {
        local_40 = stats[i + -1].coded_error;
      }
      else {
        local_40 = stats[i].coded_error;
      }
      if (local_40 <= 0.001) {
        local_50 = 0.001;
      }
      else {
        local_50 = local_40;
      }
      regions[k].avg_sr_fr_ratio =
           (stats[i].sr_coded_error / local_50) /
           (double)(int)((regions[k].last - regions[k].start) + (uint)(k != 0)) +
           regions[k].avg_sr_fr_ratio;
    }
    regions[k].avg_intra_err =
         stats[i].intra_error / (double)((regions[k].last - regions[k].start) + 1) +
         regions[k].avg_intra_err;
    regions[k].avg_coded_err =
         stats[i].coded_error / (double)((regions[k].last - regions[k].start) + 1) +
         regions[k].avg_coded_err;
    if (stats[i].cor_coeff <= 0.001) {
      local_58 = 0.001;
    }
    else {
      local_58 = stats[i].cor_coeff;
    }
    regions[k].avg_cor_coeff =
         local_58 / (double)((regions[k].last - regions[k].start) + 1) + regions[k].avg_cor_coeff;
    if (stats[i].noise_var <= 0.001) {
      local_60 = 0.001;
    }
    else {
      local_60 = stats[i].noise_var;
    }
    regions[k].avg_noise_var =
         local_60 / (double)((regions[k].last - regions[k].start) + 1) + regions[k].avg_noise_var;
  }
  return;
}

Assistant:

static void analyze_region(const FIRSTPASS_STATS *stats, int k,
                           REGIONS *regions) {
  int i;
  regions[k].avg_cor_coeff = 0;
  regions[k].avg_sr_fr_ratio = 0;
  regions[k].avg_intra_err = 0;
  regions[k].avg_coded_err = 0;

  int check_first_sr = (k != 0);

  for (i = regions[k].start; i <= regions[k].last; i++) {
    if (i > regions[k].start || check_first_sr) {
      double num_frames =
          (double)(regions[k].last - regions[k].start + check_first_sr);
      double max_coded_error =
          AOMMAX(stats[i].coded_error, stats[i - 1].coded_error);
      double this_ratio =
          stats[i].sr_coded_error / AOMMAX(max_coded_error, 0.001);
      regions[k].avg_sr_fr_ratio += this_ratio / num_frames;
    }

    regions[k].avg_intra_err +=
        stats[i].intra_error / (double)(regions[k].last - regions[k].start + 1);
    regions[k].avg_coded_err +=
        stats[i].coded_error / (double)(regions[k].last - regions[k].start + 1);

    regions[k].avg_cor_coeff +=
        AOMMAX(stats[i].cor_coeff, 0.001) /
        (double)(regions[k].last - regions[k].start + 1);
    regions[k].avg_noise_var +=
        AOMMAX(stats[i].noise_var, 0.001) /
        (double)(regions[k].last - regions[k].start + 1);
  }
}